

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

XmlNodePtr __thiscall libcellml::mathmlChildNode(libcellml *this,XmlNodePtr *node,size_t index)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  XmlNodePtr XVar3;
  shared_ptr<libcellml::XmlNode> local_50 [2];
  size_t local_30;
  size_t childNodeIndex;
  size_t local_20;
  size_t index_local;
  XmlNodePtr *node_local;
  XmlNodePtr *res;
  
  childNodeIndex._7_1_ = 0;
  local_20 = index;
  index_local = (size_t)node;
  node_local = (XmlNodePtr *)this;
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)this);
  peVar2 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = XmlNode::isMathmlElement(peVar2,(char *)0x0);
  local_30 = 0xffffffffffffffff;
  if (bVar1) {
    local_30 = 0;
  }
  while (bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)this,(nullptr_t)0x0),
        bVar1 && local_30 != local_20) {
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this);
    XmlNode::next((XmlNode *)local_50);
    std::shared_ptr<libcellml::XmlNode>::operator=((shared_ptr<libcellml::XmlNode> *)this,local_50);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(local_50);
    bVar1 = std::operator!=((shared_ptr<libcellml::XmlNode> *)this,(nullptr_t)0x0);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      bVar1 = XmlNode::isMathmlElement(peVar2,(char *)0x0);
      if (bVar1) {
        local_30 = local_30 + 1;
      }
    }
  }
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlNodePtr)XVar3.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr mathmlChildNode(const XmlNodePtr &node, size_t index)
{
    auto res = node->firstChild();
    auto childNodeIndex = res->isMathmlElement() ? 0 : MAX_SIZE_T;

    while ((res != nullptr) && (childNodeIndex != index)) {
        res = res->next();

        if ((res != nullptr) && res->isMathmlElement()) {
            ++childNodeIndex;
        }
    }

    return res;
}